

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward8.c
# Opt level: O0

list_conflict forward1(list_conflict t,int n)

{
  group_conflict g_00;
  group pgVar1;
  int local_34;
  int pos;
  group_conflict g2;
  group_conflict g;
  int n_local;
  list_conflict t_local;
  
  local_34 = 0;
  t_local = t;
  if (1 < n) {
    initmem(groupmem,0x30,n / 0xf);
    initmem(bucketmem,0x28,n / 5);
    g_00 = (group_conflict)allocmem(groupmem,0x30);
    pgVar1 = (group)allocmem(groupmem,0x30);
    g_00->nextunf = pgVar1;
    g_00->next = pgVar1;
    pgVar1->head = t;
    pgVar1->nextunf = (group)0x0;
    pgVar1->next = (group)0x0;
    pgVar1->finis = 0;
    intobuckets(g_00,forward1::b,0);
    while (g_00->nextunf != (group)0x0) {
      local_34 = local_34 + 1;
      intogroups(forward1::b,local_34);
      intobuckets(g_00,forward1::b,local_34);
    }
    t_local = collect(g_00);
    freemem(bucketmem);
    freemem(groupmem);
  }
  return t_local;
}

Assistant:

static inline list forward1(list t, int n)
{
   static bucket b[CHARS];   /* buckets */
   group g, g2;              /* groups */
   int pos = 0;              /* pos in string */

   if (n<2) return t;

   initmem(groupmem, sizeof(struct grouprec), n/15);
   initmem(bucketmem, sizeof(struct bucketrec), n/5);

   /* We use a dummy group g as the header of the group data
      structure. It does not contain any elements, but only a
      pointer to the first unfinished group. */
   g = (group) allocmem(groupmem, sizeof(struct grouprec));
   g2 = (group) allocmem(groupmem, sizeof(struct grouprec));
   g->next = g->nextunf = g2;
   g2->head = t;
   g2->next = g2->nextunf = NULL; 
   g2->finis = FALSE;

   intobuckets(g, b, pos);
   while (g->nextunf) {
      pos++;
      intogroups(b, pos);
      intobuckets(g, b, pos);
   }
   t = collect(g);

   freemem(bucketmem);
   freemem(groupmem);

   return t;
}